

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Shader>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Shader *shader,
               string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  ostream *poVar4;
  ReferenceList *references_00;
  ReferenceList *references_01;
  ReferenceList *references_02;
  ReferenceList *references_03;
  ReferenceList *references_04;
  ReferenceList *references_05;
  ReferenceList *references_06;
  ReferenceList *references_07;
  ReferenceList *references_08;
  ReferenceList *references_09;
  ReferenceList *references_10;
  ReferenceList *references_11;
  ReferenceList *references_12;
  char *pcVar5;
  UsdPreviewSurface *pUVar6;
  string shader_type;
  optional<tinyusdz::Token> pv;
  ostringstream ss_e;
  PrimReconstructOptions *in_stack_ffffffffffffce98;
  undefined1 *local_3158;
  long local_3150;
  undefined1 local_3148 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3138;
  string *local_3118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3110;
  Shader *local_30f0;
  optional<tinyusdz::Token> local_30e8 [9];
  UsdPreviewSurface local_2f70;
  
  ::std::__cxx11::string::string((string *)&local_2f70,"info:id",(allocator *)local_30e8);
  cVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  *)properties,(key_type *)&local_2f70);
  ::std::__cxx11::string::_M_dispose();
  local_3158 = local_3148;
  local_3150 = 0;
  local_3148[0] = 0;
  if ((_Rb_tree_header *)cVar3._M_node != &(properties->_M_t)._M_impl.super__Rb_tree_header) {
    if (*(uint *)((long)&cVar3._M_node[0x17]._M_parent + 4) < 2) {
      local_3118 = warn;
      Attribute::type_name_abi_cxx11_((string *)&local_2f70,(Attribute *)(cVar3._M_node + 2));
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_2f70,"token");
      ::std::__cxx11::string::_M_dispose();
      if (bVar1) {
        Attribute::get_value<tinyusdz::Token>
                  ((optional<tinyusdz::Token> *)&local_2f70,(Attribute *)(cVar3._M_node + 2));
        nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                  (local_30e8,(optional<tinyusdz::Token> *)&local_2f70);
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                  ((optional<tinyusdz::Token> *)&local_2f70);
        if (local_30e8[0].has_value_ == true) {
          nonstd::optional_lite::optional<tinyusdz::Token>::value(local_30e8);
          ::std::__cxx11::string::_M_assign((string *)&local_3158);
        }
        else {
          local_30f0 = shader;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f70);
          poVar4 = ::std::operator<<((ostream *)&local_2f70,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1271);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)&local_2f70,
                                     "Internal errror. `info:id` has invalid type.");
          ::std::operator<<(poVar4,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_3138,&local_3110,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2f70);
          shader = local_30f0;
        }
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional(local_30e8);
        warn = local_3118;
        if (local_30e8[0].has_value_ != false) {
          if (cVar3._M_node[3]._M_color != _S_black) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f70);
            poVar4 = ::std::operator<<((ostream *)&local_2f70,"[warn]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1279);
            ::std::operator<<(poVar4," ");
            poVar4 = ::std::operator<<((ostream *)&local_2f70,
                                       "`info:id` attribute must have `uniform` variability.");
            ::std::operator<<(poVar4,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30e8,&local_3138,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)local_3118,(string *)local_30e8);
              warn = local_3118;
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2f70);
          }
          goto LAB_001e40a4;
        }
        goto LAB_001e4798;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f70);
      poVar4 = ::std::operator<<((ostream *)&local_2f70,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1274);
      ::std::operator<<(poVar4," ");
      pcVar5 = "`info:id` attribute must be `token` type.";
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2f70);
      poVar4 = ::std::operator<<((ostream *)&local_2f70,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x127c);
      ::std::operator<<(poVar4," ");
      pcVar5 = "Invalid type or value for `info:id` property in `Shader`.";
    }
    poVar4 = ::std::operator<<((ostream *)&local_2f70,pcVar5);
    ::std::operator<<(poVar4,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_30e8,&local_3138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
      ::std::__cxx11::string::operator=((string *)err,(string *)local_30e8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2f70);
    goto LAB_001e4798;
  }
LAB_001e40a4:
  iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
  if (iVar2 == 0) {
    pUVar6 = &local_2f70;
    UsdPreviewSurface::UsdPreviewSurface(&local_2f70);
    bVar1 = ReconstructShader<tinyusdz::UsdPreviewSurface>
                      ((Specifier *)pUVar6,properties,references_01,&local_2f70,warn,err,
                       in_stack_ffffffffffffce98);
    if (bVar1) {
      ::std::__cxx11::string::assign((char *)&shader->info_id);
      linb::any::operator=(&(shader->value).v_,&local_2f70);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
      poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1287);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
      poVar4 = ::std::operator<<(poVar4,"UsdPreviewSurface");
      ::std::operator<<(poVar4,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::operator+(&local_3138,&local_3110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
    }
    UsdPreviewSurface::~UsdPreviewSurface(&local_2f70);
LAB_001e465c:
    if (bVar1 != false) {
      bVar1 = true;
      goto LAB_001e479a;
    }
  }
  else {
    iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
    if (iVar2 == 0) {
      pUVar6 = &local_2f70;
      UsdUVTexture::UsdUVTexture((UsdUVTexture *)&local_2f70);
      bVar1 = ReconstructShader<tinyusdz::UsdUVTexture>
                        ((Specifier *)pUVar6,properties,references_02,(UsdUVTexture *)&local_2f70,
                         warn,err,options);
      if (bVar1) {
        ::std::__cxx11::string::assign((char *)&shader->info_id);
        linb::any::operator=(&(shader->value).v_,(UsdUVTexture *)&local_2f70);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
        poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1290);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
        poVar4 = ::std::operator<<(poVar4,"UsdUVTexture");
        ::std::operator<<(poVar4,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+(&local_3138,&local_3110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
      }
      UsdUVTexture::~UsdUVTexture((UsdUVTexture *)&local_2f70);
      goto LAB_001e465c;
    }
    iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
    if (iVar2 == 0) {
      pUVar6 = &local_2f70;
      UsdPrimvarReader<int>::UsdPrimvarReader((UsdPrimvarReader<int> *)&local_2f70);
      ReconstructShader<tinyusdz::UsdPrimvarReader<int>>
                ((Specifier *)pUVar6,properties,references_03,(UsdPrimvarReader_int *)&local_2f70,
                 warn,err,in_stack_ffffffffffffce98);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
      poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1299);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
      poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_int");
      ::std::operator<<(poVar4,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::operator+(&local_3138,&local_3110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
      UsdPrimvarReader<int>::~UsdPrimvarReader((UsdPrimvarReader<int> *)&local_2f70);
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
      if (iVar2 != 0) {
        iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
        if (iVar2 == 0) {
          pUVar6 = &local_2f70;
          UsdPrimvarReader<std::array<float,_2UL>_>::UsdPrimvarReader
                    ((UsdPrimvarReader<std::array<float,_2UL>_> *)&local_2f70);
          bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                            ((Specifier *)pUVar6,properties,references_05,
                             (UsdPrimvarReader_float2 *)&local_2f70,warn,err,
                             in_stack_ffffffffffffce98);
          if (bVar1) {
            ::std::__cxx11::string::assign((char *)&shader->info_id);
            linb::any::operator=
                      (&(shader->value).v_,(UsdPrimvarReader<std::array<float,_2UL>_> *)&local_2f70)
            ;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
            poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12ab);
            ::std::operator<<(poVar4," ");
            poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
            poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_float2");
            ::std::operator<<(poVar4,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_3138,&local_3110,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
          }
          UsdPrimvarReader<std::array<float,_2UL>_>::~UsdPrimvarReader
                    ((UsdPrimvarReader<std::array<float,_2UL>_> *)&local_2f70);
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
          if (iVar2 == 0) {
            pUVar6 = &local_2f70;
            UsdPrimvarReader<std::array<float,_3UL>_>::UsdPrimvarReader
                      ((UsdPrimvarReader<std::array<float,_3UL>_> *)&local_2f70);
            bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                              ((Specifier *)pUVar6,properties,references_06,
                               (UsdPrimvarReader_float3 *)&local_2f70,warn,err,
                               in_stack_ffffffffffffce98);
            if (bVar1) {
              ::std::__cxx11::string::assign((char *)&shader->info_id);
              linb::any::operator=
                        (&(shader->value).v_,
                         (UsdPrimvarReader<std::array<float,_3UL>_> *)&local_2f70);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
              poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12b4);
              ::std::operator<<(poVar4," ");
              poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
              poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_float3");
              ::std::operator<<(poVar4,"\n");
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_3138,&local_3110,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
            }
            UsdPrimvarReader<std::array<float,_3UL>_>::~UsdPrimvarReader
                      ((UsdPrimvarReader<std::array<float,_3UL>_> *)&local_2f70);
          }
          else {
            iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
            if (iVar2 == 0) {
              pUVar6 = &local_2f70;
              UsdPrimvarReader<std::array<float,_4UL>_>::UsdPrimvarReader
                        ((UsdPrimvarReader<std::array<float,_4UL>_> *)&local_2f70);
              bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                ((Specifier *)pUVar6,properties,references_07,
                                 (UsdPrimvarReader_float4 *)&local_2f70,warn,err,
                                 in_stack_ffffffffffffce98);
              if (bVar1) {
                ::std::__cxx11::string::assign((char *)&shader->info_id);
                linb::any::operator=
                          (&(shader->value).v_,
                           (UsdPrimvarReader<std::array<float,_4UL>_> *)&local_2f70);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12bd);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
                poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_float4");
                ::std::operator<<(poVar4,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+(&local_3138,&local_3110,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
              }
              UsdPrimvarReader<std::array<float,_4UL>_>::~UsdPrimvarReader
                        ((UsdPrimvarReader<std::array<float,_4UL>_> *)&local_2f70);
            }
            else {
              iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
              if (iVar2 == 0) {
                pUVar6 = &local_2f70;
                UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::UsdPrimvarReader((UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_2f70);
                bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                  ((Specifier *)pUVar6,properties,references_08,
                                   (UsdPrimvarReader_string *)&local_2f70,warn,err,
                                   in_stack_ffffffffffffce98);
                if (bVar1) {
                  ::std::__cxx11::string::assign((char *)&shader->info_id);
                  linb::any::operator=
                            (&(shader->value).v_,
                             (UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_2f70);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                  poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
                  poVar4 = ::std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar4 = ::std::operator<<(poVar4,":");
                  poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                  poVar4 = ::std::operator<<(poVar4,"():");
                  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12c6);
                  ::std::operator<<(poVar4," ");
                  poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
                  poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_string");
                  ::std::operator<<(poVar4,"\n");
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+(&local_3138,&local_3110,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)err);
                    ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                }
                UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~UsdPrimvarReader((UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_2f70);
              }
              else {
                iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
                if (iVar2 == 0) {
                  pUVar6 = &local_2f70;
                  UsdPrimvarReader<tinyusdz::value::vector3f>::UsdPrimvarReader
                            ((UsdPrimvarReader<tinyusdz::value::vector3f> *)&local_2f70);
                  bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                    ((Specifier *)pUVar6,properties,references_09,
                                     (UsdPrimvarReader_vector *)&local_2f70,warn,err,
                                     in_stack_ffffffffffffce98);
                  if (bVar1) {
                    ::std::__cxx11::string::assign((char *)&shader->info_id);
                    linb::any::operator=
                              (&(shader->value).v_,
                               (UsdPrimvarReader<tinyusdz::value::vector3f> *)&local_2f70);
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                    poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
                    poVar4 = ::std::operator<<(poVar4,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                              );
                    poVar4 = ::std::operator<<(poVar4,":");
                    poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                    poVar4 = ::std::operator<<(poVar4,"():");
                    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12cf);
                    ::std::operator<<(poVar4," ");
                    poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
                    poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_vector");
                    ::std::operator<<(poVar4,"\n");
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+(&local_3138,&local_3110,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                  }
                  UsdPrimvarReader<tinyusdz::value::vector3f>::~UsdPrimvarReader
                            ((UsdPrimvarReader<tinyusdz::value::vector3f> *)&local_2f70);
                }
                else {
                  iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
                  if (iVar2 == 0) {
                    pUVar6 = &local_2f70;
                    UsdPrimvarReader<tinyusdz::value::normal3f>::UsdPrimvarReader
                              ((UsdPrimvarReader<tinyusdz::value::normal3f> *)&local_2f70);
                    bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                      ((Specifier *)pUVar6,properties,references_10,
                                       (UsdPrimvarReader_normal *)&local_2f70,warn,err,
                                       in_stack_ffffffffffffce98);
                    if (bVar1) {
                      ::std::__cxx11::string::assign((char *)&shader->info_id);
                      linb::any::operator=
                                (&(shader->value).v_,
                                 (UsdPrimvarReader<tinyusdz::value::normal3f> *)&local_2f70);
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                      poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
                      poVar4 = ::std::operator<<(poVar4,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                );
                      poVar4 = ::std::operator<<(poVar4,":");
                      poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                      poVar4 = ::std::operator<<(poVar4,"():");
                      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12d8);
                      ::std::operator<<(poVar4," ");
                      poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
                      poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_normal");
                      ::std::operator<<(poVar4,"\n");
                      if (err != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+(&local_3138,&local_3110,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)err);
                        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                    }
                    UsdPrimvarReader<tinyusdz::value::normal3f>::~UsdPrimvarReader
                              ((UsdPrimvarReader<tinyusdz::value::normal3f> *)&local_2f70);
                  }
                  else {
                    iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
                    if (iVar2 == 0) {
                      pUVar6 = &local_2f70;
                      UsdPrimvarReader<tinyusdz::value::point3f>::UsdPrimvarReader
                                ((UsdPrimvarReader<tinyusdz::value::point3f> *)&local_2f70);
                      bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                        ((Specifier *)pUVar6,properties,references_11,
                                         (UsdPrimvarReader_point *)&local_2f70,warn,err,
                                         in_stack_ffffffffffffce98);
                      if (bVar1) {
                        ::std::__cxx11::string::assign((char *)&shader->info_id);
                        linb::any::operator=
                                  (&(shader->value).v_,
                                   (UsdPrimvarReader<tinyusdz::value::point3f> *)&local_2f70);
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                        poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
                        poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar4 = ::std::operator<<(poVar4,":");
                        poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                        poVar4 = ::std::operator<<(poVar4,"():");
                        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12e1);
                        ::std::operator<<(poVar4," ");
                        poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
                        poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_point");
                        ::std::operator<<(poVar4,"\n");
                        if (err != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+(&local_3138,&local_3110,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)err);
                          ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                      }
                      UsdPrimvarReader<tinyusdz::value::point3f>::~UsdPrimvarReader
                                ((UsdPrimvarReader<tinyusdz::value::point3f> *)&local_2f70);
                    }
                    else {
                      iVar2 = ::std::__cxx11::string::compare((char *)&local_3158);
                      if (iVar2 == 0) {
                        pUVar6 = &local_2f70;
                        UsdTransform2d::UsdTransform2d((UsdTransform2d *)&local_2f70);
                        bVar1 = ReconstructShader<tinyusdz::UsdTransform2d>
                                          ((Specifier *)pUVar6,properties,references_12,
                                           (UsdTransform2d *)&local_2f70,warn,err,
                                           in_stack_ffffffffffffce98);
                        if (bVar1) {
                          ::std::__cxx11::string::assign((char *)&shader->info_id);
                          linb::any::operator=(&(shader->value).v_,(UsdTransform2d *)&local_2f70);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                          poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
                          poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                          poVar4 = ::std::operator<<(poVar4,":");
                          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                          poVar4 = ::std::operator<<(poVar4,"():");
                          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12ea);
                          ::std::operator<<(poVar4," ");
                          poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ")
                          ;
                          poVar4 = ::std::operator<<(poVar4,"UsdTransform2d");
                          ::std::operator<<(poVar4,"\n");
                          if (err != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+(&local_3138,&local_3110,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)err);
                            ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8)
                          ;
                        }
                        UsdTransform2d::~UsdTransform2d((UsdTransform2d *)&local_2f70);
                      }
                      else {
                        pUVar6 = &local_2f70;
                        UsdShadePrim::UsdShadePrim((UsdShadePrim *)&local_2f70);
                        bVar1 = ReconstructShader<tinyusdz::ShaderNode>
                                          ((Specifier *)pUVar6,properties,references_00,
                                           &local_2f70.super_ShaderNode,warn,err,
                                           in_stack_ffffffffffffce98);
                        if (bVar1) {
                          if (local_3150 != 0) {
                            ::std::__cxx11::string::_M_assign((string *)&shader->info_id);
                          }
                          linb::any::operator=(&(shader->value).v_,&local_2f70.super_ShaderNode);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                          poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
                          poVar4 = ::std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                          poVar4 = ::std::operator<<(poVar4,":");
                          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                          poVar4 = ::std::operator<<(poVar4,"():");
                          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12f3);
                          ::std::operator<<(poVar4," ");
                          poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ")
                          ;
                          poVar4 = ::std::operator<<(poVar4,(string *)&local_3158);
                          ::std::operator<<(poVar4,"\n");
                          if (err != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+(&local_3138,&local_3110,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)err);
                            ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8)
                          ;
                        }
                        UsdShadePrim::~UsdShadePrim((UsdShadePrim *)&local_2f70);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001e465c;
      }
      pUVar6 = &local_2f70;
      UsdPrimvarReader<float>::UsdPrimvarReader((UsdPrimvarReader<float> *)&local_2f70);
      ReconstructShader<tinyusdz::UsdPrimvarReader<float>>
                ((Specifier *)pUVar6,properties,references_04,(UsdPrimvarReader_float *)&local_2f70,
                 warn,err,in_stack_ffffffffffffce98);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
      poVar4 = ::std::operator<<((ostream *)local_30e8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x12a2);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_30e8,"Failed to Reconstruct ");
      poVar4 = ::std::operator<<(poVar4,"UsdPrimvarReader_float");
      ::std::operator<<(poVar4,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::operator+(&local_3138,&local_3110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3138);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
      UsdPrimvarReader<float>::~UsdPrimvarReader((UsdPrimvarReader<float> *)&local_2f70);
    }
  }
LAB_001e4798:
  bVar1 = false;
LAB_001e479a:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool ReconstructPrim<Shader>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Shader *shader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)properties;
  (void)options;

  bool is_generic_shader{false};
  auto info_id_prop = properties.find("info:id");
  if (info_id_prop == properties.end()) {
    // Guess MatrialX shader. info:id will be resolved by importing referenced .mtlx.
    // Treat generic Shader at the moment.
    is_generic_shader = true;
    //PUSH_ERROR_AND_RETURN("`Shader` must contain `info:id` property.");
  }

  std::string shader_type;
  if (!is_generic_shader) {
    if (info_id_prop->second.is_attribute()) {
      const Attribute &attr = info_id_prop->second.get_attribute();
      if ((attr.type_name() == value::kToken)) {
        if (auto pv = attr.get_value<value::token>()) {
          shader_type = pv.value().str();
        } else {
          PUSH_ERROR_AND_RETURN("Internal errror. `info:id` has invalid type.");
        }
      } else {
        PUSH_ERROR_AND_RETURN("`info:id` attribute must be `token` type.");
      }

      // For some corrupted? USDZ file does not have `uniform` variability.
      if (attr.variability() != Variability::Uniform) {
        PUSH_WARN("`info:id` attribute must have `uniform` variability.");
      }
    } else {
      PUSH_ERROR_AND_RETURN("Invalid type or value for `info:id` property in `Shader`.");
    }

    DCOUT("info:id = " << shader_type);
  }


  if (shader_type.compare(kUsdPreviewSurface) == 0) {
    UsdPreviewSurface surface;
    if (!ReconstructShader<UsdPreviewSurface>(spec, properties, references,
                                              &surface, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << kUsdPreviewSurface);
    }
    shader->info_id = kUsdPreviewSurface;
    shader->value = surface;
    DCOUT("info_id = " << shader->info_id);
  } else if (shader_type.compare(kUsdUVTexture) == 0) {
    UsdUVTexture texture;
    if (!ReconstructShader<UsdUVTexture>(spec, properties, references,
                                         &texture, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << kUsdUVTexture);
    }
    shader->info_id = kUsdUVTexture;
    shader->value = texture;
  } else if (shader_type.compare(kUsdPrimvarReader_int) == 0) {
    UsdPrimvarReader_int preader;
    if (!ReconstructShader<UsdPrimvarReader_int>(spec, properties, references,
                                                 &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_int);
    }
    shader->info_id = kUsdPrimvarReader_int;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float) == 0) {
    UsdPrimvarReader_float preader;
    if (!ReconstructShader<UsdPrimvarReader_float>(spec, properties, references,
                                                   &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float);
    }
    shader->info_id = kUsdPrimvarReader_float;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float2) == 0) {
    UsdPrimvarReader_float2 preader;
    if (!ReconstructShader<UsdPrimvarReader_float2>(spec, properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float2);
    }
    shader->info_id = kUsdPrimvarReader_float2;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float3) == 0) {
    UsdPrimvarReader_float3 preader;
    if (!ReconstructShader<UsdPrimvarReader_float3>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float3);
    }
    shader->info_id = kUsdPrimvarReader_float3;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float4) == 0) {
    UsdPrimvarReader_float4 preader;
    if (!ReconstructShader<UsdPrimvarReader_float4>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float4);
    }
    shader->info_id = kUsdPrimvarReader_float4;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_string) == 0) {
    UsdPrimvarReader_string preader;
    if (!ReconstructShader<UsdPrimvarReader_string>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_string);
    }
    shader->info_id = kUsdPrimvarReader_string;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_vector) == 0) {
    UsdPrimvarReader_vector preader;
    if (!ReconstructShader<UsdPrimvarReader_vector>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_vector);
    }
    shader->info_id = kUsdPrimvarReader_vector;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_normal) == 0) {
    UsdPrimvarReader_normal preader;
    if (!ReconstructShader<UsdPrimvarReader_normal>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_normal);
    }
    shader->info_id = kUsdPrimvarReader_normal;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_point) == 0) {
    UsdPrimvarReader_point preader;
    if (!ReconstructShader<UsdPrimvarReader_point>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_point);
    }
    shader->info_id = kUsdPrimvarReader_point;
    shader->value = preader;
  } else if (shader_type.compare(kUsdTransform2d) == 0) {
    UsdTransform2d transform;
    if (!ReconstructShader<UsdTransform2d>(spec,properties, references,
                                                    &transform, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdTransform2d);
    }
    shader->info_id = kUsdTransform2d;
    shader->value = transform;
  } else {
    // Reconstruct as generic ShaderNode
    ShaderNode surface;
    if (!ReconstructShader<ShaderNode>(spec,properties, references,
                                              &surface, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << shader_type);
    }
    if (shader_type.size()) {
      shader->info_id = shader_type;
    }
    shader->value = surface;
  }

  DCOUT("Shader reconstructed.");

  return true;
}